

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O3

void GetDifferenceInternal
               (S2CellId cell,S2CellUnion *y,vector<S2CellId,_std::allocator<S2CellId>_> *cell_ids)

{
  iterator __position;
  bool bVar1;
  S2CellId cell_00;
  int iVar2;
  S2CellId local_28;
  
  local_28.id_ = cell.id_;
  bVar1 = S2CellUnion::Intersects(y,cell);
  if (bVar1) {
    bVar1 = S2CellUnion::Contains(y,cell);
    if (!bVar1) {
      cell_00 = S2CellId::child_begin(&local_28);
      GetDifferenceInternal(cell_00,y,cell_ids);
      iVar2 = 3;
      do {
        cell_00.id_ = cell_00.id_ + (-cell_00.id_ & cell_00.id_) * 2;
        GetDifferenceInternal(cell_00,y,cell_ids);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
  }
  else {
    __position._M_current =
         (cell_ids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (cell_ids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<S2CellId,std::allocator<S2CellId>>::_M_realloc_insert<S2CellId_const&>
                ((vector<S2CellId,std::allocator<S2CellId>> *)cell_ids,__position,&local_28);
    }
    else {
      (__position._M_current)->id_ = cell.id_;
      (cell_ids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

static void GetDifferenceInternal(S2CellId cell,
                                  const S2CellUnion& y,
                                  vector<S2CellId>* cell_ids) {
  // Add the difference between cell and y to cell_ids.
  // If they intersect but the difference is non-empty, divide and conquer.
  if (!y.Intersects(cell)) {
    cell_ids->push_back(cell);
  } else if (!y.Contains(cell)) {
    S2CellId child = cell.child_begin();
    for (int i = 0; ; ++i) {
      GetDifferenceInternal(child, y, cell_ids);
      if (i == 3) break;  // Avoid unnecessary next() computation.
      child = child.next();
    }
  }
}